

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Resize
          (RepeatedField<unsigned_long> *this,int new_size,unsigned_long *value)

{
  unsigned_long *puVar1;
  int in_ESI;
  int *in_RDI;
  int in_stack_0000008c;
  RepeatedField<unsigned_long> *in_stack_00000090;
  unsigned_long *in_stack_ffffffffffffff80;
  RepeatedField<unsigned_long> *in_stack_ffffffffffffffe0;
  
  if (*in_RDI < in_ESI) {
    Reserve(in_stack_00000090,in_stack_0000008c);
    puVar1 = elements(in_stack_ffffffffffffffe0);
    puVar1 = puVar1 + *in_RDI;
    elements(in_stack_ffffffffffffffe0);
    std::fill<unsigned_long*,unsigned_long>
              (in_stack_ffffffffffffff80,puVar1,(unsigned_long *)0x3e3162);
  }
  *in_RDI = in_ESI;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}